

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O3

void anon_unknown.dwarf_6bf46c::sha1::Transform(uint32_t *s,uchar *chunk)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  long in_FS_OFFSET;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *s;
  uVar2 = s[1];
  uVar3 = s[2];
  uVar4 = s[3];
  uVar14 = *(uint *)chunk;
  uVar7 = *(uint *)(chunk + 4);
  uVar15 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar17 = uVar2 << 0x1e | uVar2 >> 2;
  uVar9 = (uVar1 << 5 | uVar1 >> 0x1b) + s[4] + ((uVar4 ^ uVar3) & uVar2 ^ uVar4) +
          uVar15 + 0x5a827999;
  uVar27 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  uVar21 = ((uVar3 ^ uVar17) & uVar1 ^ uVar3) + uVar4 + uVar27 + 0x5a827999 +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar7 = uVar1 << 0x1e | uVar1 >> 2;
  uVar14 = *(uint *)(chunk + 8);
  uVar6 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar8 = ((uVar17 ^ uVar7) & uVar9 ^ uVar17) + uVar3 + uVar6 + 0x5a827999 +
          (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar10 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar14 = *(uint *)(chunk + 0xc);
  uVar9 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar18 = uVar17 + uVar9 + ((uVar10 ^ uVar7) & uVar21 ^ uVar7) + 0x5a827999 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar22 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar14 = *(uint *)(chunk + 0x10);
  uVar17 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar21 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar7 = uVar7 + uVar17 + ((uVar22 ^ uVar10) & uVar8 ^ uVar10) + 0x5a827999 +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar14 = *(uint *)(chunk + 0x14);
  uVar8 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar11 = uVar10 + uVar8 + ((uVar21 ^ uVar22) & uVar18 ^ uVar22) + 0x5a827999 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar19 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar14 = *(uint *)(chunk + 0x18);
  uVar10 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar23 = uVar22 + uVar10 + ((uVar19 ^ uVar21) & uVar7 ^ uVar21) + 0x5a827999 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar7 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar14 = *(uint *)(chunk + 0x1c);
  uVar18 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar22 = uVar21 + uVar18 + ((uVar7 ^ uVar19) & uVar11 ^ uVar19) + 0x5a827999 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar12 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar14 = *(uint *)(chunk + 0x20);
  uVar30 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar24 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar19 = uVar19 + uVar30 + ((uVar12 ^ uVar7) & uVar23 ^ uVar7) + 0x5a827999 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar14 = *(uint *)(chunk + 0x24);
  uVar21 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar7 = uVar7 + uVar21 + ((uVar24 ^ uVar12) & uVar22 ^ uVar12) + 0x5a827999 +
          (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar23 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar14 = *(uint *)(chunk + 0x28);
  uVar11 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar13 = uVar12 + uVar11 + ((uVar23 ^ uVar24) & uVar19 ^ uVar24) + 0x5a827999 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar20 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar14 = *(uint *)(chunk + 0x2c);
  uVar22 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar25 = uVar24 + uVar22 + ((uVar20 ^ uVar23) & uVar7 ^ uVar23) + 0x5a827999 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar19 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar14 = *(uint *)(chunk + 0x30);
  uVar12 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar24 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar23 = uVar23 + uVar12 + ((uVar19 ^ uVar20) & uVar13 ^ uVar20) + 0x5a827999 +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar14 = *(uint *)(chunk + 0x34);
  uVar16 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar20 = uVar20 + uVar16 + ((uVar24 ^ uVar19) & uVar25 ^ uVar19) + 0x5a827999 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar25 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar14 = *(uint *)(chunk + 0x38);
  uVar7 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar19 = uVar19 + uVar7 + ((uVar25 ^ uVar24) & uVar23 ^ uVar24) + 0x5a827999 +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar13 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar14 = *(uint *)(chunk + 0x3c);
  uVar31 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  uVar14 = uVar24 + uVar31 + ((uVar13 ^ uVar25) & uVar20 ^ uVar25) + 0x5a827999 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar23 = uVar30 ^ uVar16 ^ uVar15 ^ uVar6;
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar28 = uVar23 << 1 | (uint)((int)uVar23 < 0);
  uVar23 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar26 = uVar25 + uVar28 + ((uVar20 ^ uVar13) & uVar19 ^ uVar13) + 0x5a827999 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar19 = uVar21 ^ uVar7 ^ uVar27 ^ uVar9;
  uVar27 = uVar19 << 1 | (uint)((int)uVar19 < 0);
  uVar19 = uVar13 + uVar27 + ((uVar23 ^ uVar20) & uVar14 ^ uVar20) + 0x5a827999 +
           (uVar26 * 0x20 | uVar26 >> 0x1b);
  uVar6 = uVar11 ^ uVar31 ^ uVar6 ^ uVar17;
  uVar24 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar15 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar25 = uVar20 + uVar15 + ((uVar24 ^ uVar23) & uVar26 ^ uVar23) + 0x5a827999 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar26 = uVar26 * 0x40000000 | uVar26 >> 2;
  uVar14 = uVar9 ^ uVar8 ^ uVar22 ^ uVar28;
  uVar9 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar13 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar6 = uVar23 + uVar9 + ((uVar26 ^ uVar24) & uVar19 ^ uVar24) + 0x5a827999 +
          (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar14 = uVar17 ^ uVar10 ^ uVar12 ^ uVar27;
  uVar20 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar17 = uVar24 + uVar20 + (uVar13 ^ uVar26 ^ uVar25) + 0x6ed9eba1 +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar24 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar14 = uVar8 ^ uVar18 ^ uVar16 ^ uVar15;
  uVar14 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar25 = uVar26 + uVar14 + (uVar24 ^ uVar13 ^ uVar6) + 0x6ed9eba1 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar8 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar6 = uVar10 ^ uVar30 ^ uVar7 ^ uVar9;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar23 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar19 = uVar13 + uVar6 + (uVar8 ^ uVar24 ^ uVar17) + 0x6ed9eba1 +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar17 = uVar18 ^ uVar21 ^ uVar31 ^ uVar20;
  uVar10 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar18 = uVar24 + uVar10 + (uVar23 ^ uVar8 ^ uVar25) + 0x6ed9eba1 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar24 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar17 = uVar30 ^ uVar11 ^ uVar28 ^ uVar14;
  uVar30 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar8 = uVar8 + uVar30 + (uVar24 ^ uVar23 ^ uVar19) + 0x6ed9eba1 +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar17 = uVar21 ^ uVar22 ^ uVar27 ^ uVar6;
  uVar13 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar23 = uVar23 + uVar13 + (uVar19 ^ uVar24 ^ uVar18) + 0x6ed9eba1 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar25 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar17 = uVar11 ^ uVar12 ^ uVar15 ^ uVar10;
  uVar18 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar21 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar26 = uVar24 + uVar18 + (uVar25 ^ uVar19 ^ uVar8) + 0x6ed9eba1 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar17 = uVar22 ^ uVar16 ^ uVar9 ^ uVar30;
  uVar24 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar8 = uVar19 + uVar24 + (uVar21 ^ uVar25 ^ uVar23) + 0x6ed9eba1 +
          (uVar26 * 0x20 | uVar26 >> 0x1b);
  uVar11 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar17 = uVar12 ^ uVar7 ^ uVar20 ^ uVar13;
  uVar17 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar12 = uVar25 + uVar17 + (uVar11 ^ uVar21 ^ uVar26) + 0x6ed9eba1 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar25 = uVar26 * 0x40000000 | uVar26 >> 2;
  uVar22 = uVar16 ^ uVar31 ^ uVar14 ^ uVar18;
  uVar23 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar21 = uVar21 + uVar23 + (uVar25 ^ uVar11 ^ uVar8) + 0x6ed9eba1 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar22 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar7 = uVar7 ^ uVar28 ^ uVar6 ^ uVar24;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar19 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar11 = uVar11 + uVar7 + (uVar22 ^ uVar25 ^ uVar12) + 0x6ed9eba1 +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar8 = uVar31 ^ uVar27 ^ uVar10 ^ uVar17;
  uVar8 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar16 = uVar25 + uVar8 + (uVar19 ^ uVar22 ^ uVar21) + 0x6ed9eba1 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar12 = uVar28 ^ uVar15 ^ uVar30 ^ uVar23;
  uVar26 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar22 = uVar22 + uVar26 + (uVar21 ^ uVar19 ^ uVar11) + 0x6ed9eba1 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar12 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar11 = uVar27 ^ uVar9 ^ uVar13 ^ uVar7;
  uVar31 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar19 = uVar19 + uVar31 + (uVar12 ^ uVar21 ^ uVar16) + 0x6ed9eba1 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar16 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar11 = uVar15 ^ uVar20 ^ uVar18 ^ uVar8;
  uVar27 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar11 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar21 = uVar21 + uVar27 + (uVar16 ^ uVar12 ^ uVar22) + 0x6ed9eba1 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar9 = uVar9 ^ uVar14 ^ uVar24 ^ uVar26;
  uVar15 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar22 = uVar12 + uVar15 + (uVar11 ^ uVar16 ^ uVar19) + 0x6ed9eba1 +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar12 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar9 = uVar20 ^ uVar6 ^ uVar17 ^ uVar31;
  uVar28 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar19 = uVar16 + uVar28 + (uVar12 ^ uVar11 ^ uVar21) + 0x6ed9eba1 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar9 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar14 = uVar14 ^ uVar10 ^ uVar23 ^ uVar27;
  uVar20 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar14 = uVar11 + uVar20 + (uVar9 ^ uVar12 ^ uVar22) + 0x6ed9eba1 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar21 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar6 = uVar6 ^ uVar30 ^ uVar7 ^ uVar15;
  uVar16 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar11 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar22 = uVar12 + uVar16 + (uVar21 ^ uVar9 ^ uVar19) + 0x6ed9eba1 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar6 = uVar10 ^ uVar13 ^ uVar8 ^ uVar28;
  uVar25 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar6 = uVar9 + uVar25 + (uVar11 ^ uVar21 ^ uVar14) + 0x6ed9eba1 +
          (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar10 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar14 = uVar30 ^ uVar18 ^ uVar26 ^ uVar20;
  uVar9 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar21 = uVar21 + uVar9 + ((uVar22 | uVar10) & uVar11 | uVar22 & uVar10) + -0x70e44324 +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar22 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar14 = uVar13 ^ uVar24 ^ uVar31 ^ uVar16;
  uVar19 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar11 = uVar11 + uVar19 + ((uVar6 | uVar22) & uVar10 | uVar6 & uVar22) + -0x70e44324 +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar14 = uVar18 ^ uVar17 ^ uVar27 ^ uVar25;
  uVar18 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar10 = uVar10 + uVar18 + ((uVar21 | uVar6) & uVar22 | uVar21 & uVar6) + -0x70e44324 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar14 = uVar24 ^ uVar23 ^ uVar15 ^ uVar9;
  uVar30 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar22 = uVar22 + uVar30 + ((uVar11 | uVar21) & uVar6 | uVar11 & uVar21) + -0x70e44324 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar11 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar14 = uVar17 ^ uVar7 ^ uVar28 ^ uVar19;
  uVar14 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar6 = uVar6 + uVar14 + ((uVar10 | uVar11) & uVar21 | uVar10 & uVar11) + -0x70e44324 +
          (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar17 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar10 = uVar23 ^ uVar8 ^ uVar20 ^ uVar18;
  uVar23 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar21 = uVar21 + uVar23 + ((uVar22 | uVar17) & uVar11 | uVar22 & uVar17) + -0x70e44324 +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar22 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar7 = uVar7 ^ uVar26 ^ uVar16 ^ uVar30;
  uVar10 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar11 = uVar11 + uVar10 + ((uVar6 | uVar22) & uVar17 | uVar6 & uVar22) + -0x70e44324 +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = uVar8 ^ uVar31 ^ uVar25 ^ uVar14;
  uVar8 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar7 = uVar17 + uVar8 + ((uVar21 | uVar6) & uVar22 | uVar21 & uVar6) + -0x70e44324 +
          (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar17 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar21 = uVar26 ^ uVar27 ^ uVar9 ^ uVar23;
  uVar26 = uVar21 << 1 | (uint)((int)uVar21 < 0);
  uVar21 = uVar22 + uVar26 + ((uVar11 | uVar17) & uVar6 | uVar11 & uVar17) + -0x70e44324 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar12 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar22 = uVar31 ^ uVar15 ^ uVar19 ^ uVar10;
  uVar32 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar6 = uVar6 + uVar32 + ((uVar7 | uVar12) & uVar17 | uVar7 & uVar12) + -0x70e44324 +
          (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar22 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar7 = uVar27 ^ uVar28 ^ uVar18 ^ uVar8;
  uVar27 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar11 = uVar17 + uVar27 + ((uVar21 | uVar22) & uVar12 | uVar21 & uVar22) + -0x70e44324 +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar13 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar7 = uVar15 ^ uVar20 ^ uVar30 ^ uVar26;
  uVar21 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar24 = uVar12 + uVar21 + ((uVar6 | uVar13) & uVar22 | uVar6 & uVar13) + -0x70e44324 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar17 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = uVar28 ^ uVar16 ^ uVar14 ^ uVar32;
  uVar31 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar22 = uVar22 + uVar31 + ((uVar11 | uVar17) & uVar13 | uVar11 & uVar17) + -0x70e44324 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar12 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar7 = uVar20 ^ uVar25 ^ uVar23 ^ uVar27;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar13 = uVar13 + uVar7 + ((uVar24 | uVar12) & uVar17 | uVar24 & uVar12) + -0x70e44324 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar24 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar6 = uVar16 ^ uVar9 ^ uVar10 ^ uVar21;
  uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar17 = uVar17 + uVar6 + ((uVar22 | uVar24) & uVar12 | uVar22 & uVar24) + -0x70e44324 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar11 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar22 = uVar25 ^ uVar19 ^ uVar8 ^ uVar31;
  uVar28 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar12 = uVar12 + uVar28 + ((uVar13 | uVar11) & uVar24 | uVar13 & uVar11) + -0x70e44324 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar9 = uVar9 ^ uVar18 ^ uVar26 ^ uVar7;
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar24 = uVar24 + uVar9 + ((uVar17 | uVar13) & uVar11 | uVar17 & uVar13) + -0x70e44324 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar22 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar17 = uVar19 ^ uVar30 ^ uVar32 ^ uVar6;
  uVar19 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar11 = uVar11 + uVar19 + ((uVar12 | uVar22) & uVar13 | uVar12 & uVar22) + -0x70e44324 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar12 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar17 = uVar18 ^ uVar14 ^ uVar27 ^ uVar28;
  uVar17 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar13 = uVar13 + uVar17 + ((uVar24 | uVar12) & uVar22 | uVar24 & uVar12) + -0x70e44324 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar15 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar18 = uVar30 ^ uVar23 ^ uVar21 ^ uVar9;
  uVar30 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar18 = uVar22 + uVar30 + ((uVar11 | uVar15) & uVar12 | uVar11 & uVar15) + -0x70e44324 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar22 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar14 = uVar14 ^ uVar10 ^ uVar31 ^ uVar19;
  uVar14 = uVar14 << 1 | (uint)((int)uVar14 < 0);
  uVar24 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar11 = uVar12 + uVar14 + (uVar22 ^ uVar15 ^ uVar13) + -0x359d3e2a +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar12 = uVar23 ^ uVar8 ^ uVar7 ^ uVar17;
  uVar23 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar15 = uVar15 + uVar23 + (uVar24 ^ uVar22 ^ uVar18) + -0x359d3e2a +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar10 = uVar10 ^ uVar26 ^ uVar6 ^ uVar30;
  uVar10 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar22 = uVar22 + uVar10 + (uVar18 ^ uVar24 ^ uVar11) + -0x359d3e2a +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar12 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar8 = uVar8 ^ uVar32 ^ uVar28 ^ uVar14;
  uVar8 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar13 = uVar24 + uVar8 + (uVar12 ^ uVar18 ^ uVar15) + -0x359d3e2a +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar15 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar11 = uVar26 ^ uVar27 ^ uVar9 ^ uVar23;
  uVar25 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar11 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar18 = uVar18 + uVar25 + (uVar15 ^ uVar12 ^ uVar22) + -0x359d3e2a +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar22 = uVar32 ^ uVar21 ^ uVar19 ^ uVar10;
  uVar32 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar22 = uVar12 + uVar32 + (uVar11 ^ uVar15 ^ uVar13) + -0x359d3e2a +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar24 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar12 = uVar27 ^ uVar31 ^ uVar17 ^ uVar8;
  uVar26 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar15 = uVar15 + uVar26 + (uVar24 ^ uVar11 ^ uVar18) + -0x359d3e2a +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar21 = uVar21 ^ uVar7 ^ uVar30 ^ uVar25;
  uVar12 = uVar21 << 1 | (uint)((int)uVar21 < 0);
  uVar21 = uVar11 + uVar12 + (uVar18 ^ uVar24 ^ uVar22) + -0x359d3e2a +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar22 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar11 = uVar31 ^ uVar6 ^ uVar14 ^ uVar32;
  uVar13 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar16 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar11 = uVar24 + uVar13 + (uVar22 ^ uVar18 ^ uVar15) + -0x359d3e2a +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar7 = uVar7 ^ uVar28 ^ uVar23 ^ uVar26;
  uVar24 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar18 = uVar18 + uVar24 + (uVar16 ^ uVar22 ^ uVar21) + -0x359d3e2a +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar7 = uVar6 ^ uVar9 ^ uVar10 ^ uVar12;
  uVar15 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar22 = uVar22 + uVar15 + (uVar21 ^ uVar16 ^ uVar11) + -0x359d3e2a +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar20 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar7 = uVar28 ^ uVar19 ^ uVar8 ^ uVar13;
  uVar6 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar16 = uVar16 + uVar6 + (uVar20 ^ uVar21 ^ uVar18) + -0x359d3e2a +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar7 = uVar9 ^ uVar17 ^ uVar25 ^ uVar24;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar11 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar21 = uVar21 + uVar7 + (uVar18 ^ uVar20 ^ uVar22) + -0x359d3e2a +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar9 = uVar19 ^ uVar30 ^ uVar32 ^ uVar15;
  uVar22 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar19 = uVar20 + uVar22 + (uVar11 ^ uVar18 ^ uVar16) + -0x359d3e2a +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar20 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar9 = uVar17 ^ uVar14 ^ uVar26 ^ uVar6;
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar17 = uVar18 + uVar9 + (uVar20 ^ uVar11 ^ uVar21) + -0x359d3e2a +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar7 = uVar30 ^ uVar23 ^ uVar12 ^ uVar7;
  uVar18 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar12 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar21 = uVar11 + uVar12 + (uVar18 ^ uVar20 ^ uVar19) + -0x359d3e2a +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar22 = uVar14 ^ uVar10 ^ uVar13 ^ uVar22;
  uVar14 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar7 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar22 = uVar20 + uVar7 + (uVar14 ^ uVar18 ^ uVar17) + -0x359d3e2a +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar9 = uVar23 ^ uVar8 ^ uVar24 ^ uVar9;
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar12 = uVar25 ^ uVar10 ^ uVar15 ^ uVar12;
  uVar10 = (uVar9 << 1 | (uint)((int)uVar9 < 0)) + uVar18 + (uVar17 ^ uVar14 ^ uVar21) + -0x359d3e2a
           + (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar9 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar7 = uVar32 ^ uVar8 ^ uVar6 ^ uVar7;
  iVar29 = (uVar12 << 1 | (uint)((int)uVar12 < 0)) + uVar14 + (uVar9 ^ uVar17 ^ uVar22) +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar6 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar14 = iVar29 + 0xca62c1d6;
  *s = (uVar7 << 1 | (uint)((int)uVar7 < 0)) + uVar1 + uVar17 + (uVar6 ^ uVar9 ^ uVar10) +
       -0x359d3e2a + (uVar14 * 0x20 | uVar14 >> 0x1b);
  s[1] = uVar2 + iVar29 + 0xca62c1d6;
  s[2] = (uVar10 * 0x40000000 | uVar10 >> 2) + uVar3;
  s[3] = uVar6 + uVar4;
  s[4] = uVar9 + s[4];
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Transform(uint32_t* s, const unsigned char* chunk)
{
    uint32_t a = s[0], b = s[1], c = s[2], d = s[3], e = s[4];
    uint32_t w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

    Round(a, b, c, d, e, f1(b, c, d), k1, w0 = ReadBE32(chunk + 0));
    Round(e, a, b, c, d, f1(a, b, c), k1, w1 = ReadBE32(chunk + 4));
    Round(d, e, a, b, c, f1(e, a, b), k1, w2 = ReadBE32(chunk + 8));
    Round(c, d, e, a, b, f1(d, e, a), k1, w3 = ReadBE32(chunk + 12));
    Round(b, c, d, e, a, f1(c, d, e), k1, w4 = ReadBE32(chunk + 16));
    Round(a, b, c, d, e, f1(b, c, d), k1, w5 = ReadBE32(chunk + 20));
    Round(e, a, b, c, d, f1(a, b, c), k1, w6 = ReadBE32(chunk + 24));
    Round(d, e, a, b, c, f1(e, a, b), k1, w7 = ReadBE32(chunk + 28));
    Round(c, d, e, a, b, f1(d, e, a), k1, w8 = ReadBE32(chunk + 32));
    Round(b, c, d, e, a, f1(c, d, e), k1, w9 = ReadBE32(chunk + 36));
    Round(a, b, c, d, e, f1(b, c, d), k1, w10 = ReadBE32(chunk + 40));
    Round(e, a, b, c, d, f1(a, b, c), k1, w11 = ReadBE32(chunk + 44));
    Round(d, e, a, b, c, f1(e, a, b), k1, w12 = ReadBE32(chunk + 48));
    Round(c, d, e, a, b, f1(d, e, a), k1, w13 = ReadBE32(chunk + 52));
    Round(b, c, d, e, a, f1(c, d, e), k1, w14 = ReadBE32(chunk + 56));
    Round(a, b, c, d, e, f1(b, c, d), k1, w15 = ReadBE32(chunk + 60));

    Round(e, a, b, c, d, f1(a, b, c), k1, w0 = left(w0 ^ w13 ^ w8 ^ w2));
    Round(d, e, a, b, c, f1(e, a, b), k1, w1 = left(w1 ^ w14 ^ w9 ^ w3));
    Round(c, d, e, a, b, f1(d, e, a), k1, w2 = left(w2 ^ w15 ^ w10 ^ w4));
    Round(b, c, d, e, a, f1(c, d, e), k1, w3 = left(w3 ^ w0 ^ w11 ^ w5));
    Round(a, b, c, d, e, f2(b, c, d), k2, w4 = left(w4 ^ w1 ^ w12 ^ w6));
    Round(e, a, b, c, d, f2(a, b, c), k2, w5 = left(w5 ^ w2 ^ w13 ^ w7));
    Round(d, e, a, b, c, f2(e, a, b), k2, w6 = left(w6 ^ w3 ^ w14 ^ w8));
    Round(c, d, e, a, b, f2(d, e, a), k2, w7 = left(w7 ^ w4 ^ w15 ^ w9));
    Round(b, c, d, e, a, f2(c, d, e), k2, w8 = left(w8 ^ w5 ^ w0 ^ w10));
    Round(a, b, c, d, e, f2(b, c, d), k2, w9 = left(w9 ^ w6 ^ w1 ^ w11));
    Round(e, a, b, c, d, f2(a, b, c), k2, w10 = left(w10 ^ w7 ^ w2 ^ w12));
    Round(d, e, a, b, c, f2(e, a, b), k2, w11 = left(w11 ^ w8 ^ w3 ^ w13));
    Round(c, d, e, a, b, f2(d, e, a), k2, w12 = left(w12 ^ w9 ^ w4 ^ w14));
    Round(b, c, d, e, a, f2(c, d, e), k2, w13 = left(w13 ^ w10 ^ w5 ^ w15));
    Round(a, b, c, d, e, f2(b, c, d), k2, w14 = left(w14 ^ w11 ^ w6 ^ w0));
    Round(e, a, b, c, d, f2(a, b, c), k2, w15 = left(w15 ^ w12 ^ w7 ^ w1));

    Round(d, e, a, b, c, f2(e, a, b), k2, w0 = left(w0 ^ w13 ^ w8 ^ w2));
    Round(c, d, e, a, b, f2(d, e, a), k2, w1 = left(w1 ^ w14 ^ w9 ^ w3));
    Round(b, c, d, e, a, f2(c, d, e), k2, w2 = left(w2 ^ w15 ^ w10 ^ w4));
    Round(a, b, c, d, e, f2(b, c, d), k2, w3 = left(w3 ^ w0 ^ w11 ^ w5));
    Round(e, a, b, c, d, f2(a, b, c), k2, w4 = left(w4 ^ w1 ^ w12 ^ w6));
    Round(d, e, a, b, c, f2(e, a, b), k2, w5 = left(w5 ^ w2 ^ w13 ^ w7));
    Round(c, d, e, a, b, f2(d, e, a), k2, w6 = left(w6 ^ w3 ^ w14 ^ w8));
    Round(b, c, d, e, a, f2(c, d, e), k2, w7 = left(w7 ^ w4 ^ w15 ^ w9));
    Round(a, b, c, d, e, f3(b, c, d), k3, w8 = left(w8 ^ w5 ^ w0 ^ w10));
    Round(e, a, b, c, d, f3(a, b, c), k3, w9 = left(w9 ^ w6 ^ w1 ^ w11));
    Round(d, e, a, b, c, f3(e, a, b), k3, w10 = left(w10 ^ w7 ^ w2 ^ w12));
    Round(c, d, e, a, b, f3(d, e, a), k3, w11 = left(w11 ^ w8 ^ w3 ^ w13));
    Round(b, c, d, e, a, f3(c, d, e), k3, w12 = left(w12 ^ w9 ^ w4 ^ w14));
    Round(a, b, c, d, e, f3(b, c, d), k3, w13 = left(w13 ^ w10 ^ w5 ^ w15));
    Round(e, a, b, c, d, f3(a, b, c), k3, w14 = left(w14 ^ w11 ^ w6 ^ w0));
    Round(d, e, a, b, c, f3(e, a, b), k3, w15 = left(w15 ^ w12 ^ w7 ^ w1));

    Round(c, d, e, a, b, f3(d, e, a), k3, w0 = left(w0 ^ w13 ^ w8 ^ w2));
    Round(b, c, d, e, a, f3(c, d, e), k3, w1 = left(w1 ^ w14 ^ w9 ^ w3));
    Round(a, b, c, d, e, f3(b, c, d), k3, w2 = left(w2 ^ w15 ^ w10 ^ w4));
    Round(e, a, b, c, d, f3(a, b, c), k3, w3 = left(w3 ^ w0 ^ w11 ^ w5));
    Round(d, e, a, b, c, f3(e, a, b), k3, w4 = left(w4 ^ w1 ^ w12 ^ w6));
    Round(c, d, e, a, b, f3(d, e, a), k3, w5 = left(w5 ^ w2 ^ w13 ^ w7));
    Round(b, c, d, e, a, f3(c, d, e), k3, w6 = left(w6 ^ w3 ^ w14 ^ w8));
    Round(a, b, c, d, e, f3(b, c, d), k3, w7 = left(w7 ^ w4 ^ w15 ^ w9));
    Round(e, a, b, c, d, f3(a, b, c), k3, w8 = left(w8 ^ w5 ^ w0 ^ w10));
    Round(d, e, a, b, c, f3(e, a, b), k3, w9 = left(w9 ^ w6 ^ w1 ^ w11));
    Round(c, d, e, a, b, f3(d, e, a), k3, w10 = left(w10 ^ w7 ^ w2 ^ w12));
    Round(b, c, d, e, a, f3(c, d, e), k3, w11 = left(w11 ^ w8 ^ w3 ^ w13));
    Round(a, b, c, d, e, f2(b, c, d), k4, w12 = left(w12 ^ w9 ^ w4 ^ w14));
    Round(e, a, b, c, d, f2(a, b, c), k4, w13 = left(w13 ^ w10 ^ w5 ^ w15));
    Round(d, e, a, b, c, f2(e, a, b), k4, w14 = left(w14 ^ w11 ^ w6 ^ w0));
    Round(c, d, e, a, b, f2(d, e, a), k4, w15 = left(w15 ^ w12 ^ w7 ^ w1));

    Round(b, c, d, e, a, f2(c, d, e), k4, w0 = left(w0 ^ w13 ^ w8 ^ w2));
    Round(a, b, c, d, e, f2(b, c, d), k4, w1 = left(w1 ^ w14 ^ w9 ^ w3));
    Round(e, a, b, c, d, f2(a, b, c), k4, w2 = left(w2 ^ w15 ^ w10 ^ w4));
    Round(d, e, a, b, c, f2(e, a, b), k4, w3 = left(w3 ^ w0 ^ w11 ^ w5));
    Round(c, d, e, a, b, f2(d, e, a), k4, w4 = left(w4 ^ w1 ^ w12 ^ w6));
    Round(b, c, d, e, a, f2(c, d, e), k4, w5 = left(w5 ^ w2 ^ w13 ^ w7));
    Round(a, b, c, d, e, f2(b, c, d), k4, w6 = left(w6 ^ w3 ^ w14 ^ w8));
    Round(e, a, b, c, d, f2(a, b, c), k4, w7 = left(w7 ^ w4 ^ w15 ^ w9));
    Round(d, e, a, b, c, f2(e, a, b), k4, w8 = left(w8 ^ w5 ^ w0 ^ w10));
    Round(c, d, e, a, b, f2(d, e, a), k4, w9 = left(w9 ^ w6 ^ w1 ^ w11));
    Round(b, c, d, e, a, f2(c, d, e), k4, w10 = left(w10 ^ w7 ^ w2 ^ w12));
    Round(a, b, c, d, e, f2(b, c, d), k4, w11 = left(w11 ^ w8 ^ w3 ^ w13));
    Round(e, a, b, c, d, f2(a, b, c), k4, w12 = left(w12 ^ w9 ^ w4 ^ w14));
    Round(d, e, a, b, c, f2(e, a, b), k4, left(w13 ^ w10 ^ w5 ^ w15));
    Round(c, d, e, a, b, f2(d, e, a), k4, left(w14 ^ w11 ^ w6 ^ w0));
    Round(b, c, d, e, a, f2(c, d, e), k4, left(w15 ^ w12 ^ w7 ^ w1));

    s[0] += a;
    s[1] += b;
    s[2] += c;
    s[3] += d;
    s[4] += e;
}